

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O2

void Imath_3_2::jacobiSVD<float>
               (Matrix44<float> *A,Matrix44<float> *U,Vec4<float> *S,Matrix44<float> *V,float tol,
               bool forcePositiveDeterminant)

{
  float *pfVar1;
  float *pfVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  long lVar10;
  float *pfVar11;
  long lVar12;
  float *pfVar13;
  long lVar14;
  float *pfVar15;
  float *pfVar16;
  long lVar17;
  float fVar18;
  float fVar19;
  float local_90 [4];
  Vec4<float> uCol;
  Matrix44<float> local_70;
  
  Matrix44<float>::Matrix44(&local_70,A);
  U->x[0][0] = 1.0;
  *(float *)((long)(U->x + 0) + 4) = 0.0;
  *(float *)((long)(U->x + 0) + 8) = 0.0;
  *(undefined8 *)(U->x[0] + 3) = 0;
  U->x[1][1] = 1.0;
  *(float *)((long)(U->x + 1) + 8) = 0.0;
  *(float *)((long)(U->x + 1) + 0xc) = 0.0;
  *(float *)((long)(U->x + 2) + 0) = 0.0;
  *(float *)((long)(U->x + 2) + 4) = 0.0;
  U->x[2][2] = 1.0;
  *(undefined8 *)(U->x[2] + 3) = 0;
  *(float *)((long)(U->x + 3) + 4) = 0.0;
  *(float *)((long)(U->x + 3) + 8) = 0.0;
  U->x[3][3] = 1.0;
  V->x[0][0] = 1.0;
  *(float *)((long)(V->x + 0) + 4) = 0.0;
  *(float *)((long)(V->x + 0) + 8) = 0.0;
  *(undefined8 *)(V->x[0] + 3) = 0;
  V->x[1][1] = 1.0;
  *(float *)((long)(V->x + 1) + 8) = 0.0;
  *(float *)((long)(V->x + 1) + 0xc) = 0.0;
  *(float *)((long)(V->x + 2) + 0) = 0.0;
  *(float *)((long)(V->x + 2) + 4) = 0.0;
  V->x[2][2] = 1.0;
  *(undefined8 *)(V->x[2] + 3) = 0;
  *(float *)((long)(V->x + 3) + 4) = 0.0;
  *(float *)((long)(V->x + 3) + 8) = 0.0;
  V->x[3][3] = 1.0;
  fVar18 = anon_unknown_20::maxOffDiag<float>(&local_70);
  fVar18 = fVar18 * tol;
  if ((fVar18 != 0.0) || (NAN(fVar18))) {
    uVar3 = 0;
    while( true ) {
      bVar4 = anon_unknown_20::twoSidedJacobiRotation<float>(&local_70,0,1,U,V,tol);
      bVar5 = anon_unknown_20::twoSidedJacobiRotation<float>(&local_70,0,2,U,V,tol);
      bVar6 = anon_unknown_20::twoSidedJacobiRotation<float>(&local_70,0,3,U,V,tol);
      bVar7 = anon_unknown_20::twoSidedJacobiRotation<float>(&local_70,1,2,U,V,tol);
      bVar8 = anon_unknown_20::twoSidedJacobiRotation<float>(&local_70,1,3,U,V,tol);
      bVar9 = anon_unknown_20::twoSidedJacobiRotation<float>(&local_70,2,3,U,V,tol);
      if (((((!bVar9) && (!bVar8)) && (!bVar7)) && ((!bVar6 && (!bVar4)))) && (!bVar5)) break;
      fVar19 = anon_unknown_20::maxOffDiag<float>(&local_70);
      if ((fVar19 <= fVar18) || (bVar4 = 0x12 < uVar3, uVar3 = uVar3 + 1, bVar4)) break;
    }
  }
  pfVar1 = U->x[0] + 1;
  pfVar2 = V->x[0] + 1;
  S->x = local_70.x[0][0];
  S->y = local_70.x[1][1];
  S->z = local_70.x[2][2];
  S->w = local_70.x[3][3];
  pfVar11 = (float *)U;
  for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
    if ((&S->x)[lVar10] < 0.0) {
      (&S->x)[lVar10] = -(&S->x)[lVar10];
      for (lVar12 = 0; lVar12 != 0x40; lVar12 = lVar12 + 0x10) {
        *(uint *)((long)pfVar11 + lVar12) = *(uint *)((long)pfVar11 + lVar12) ^ 0x80000000;
      }
    }
    pfVar11 = pfVar11 + 1;
  }
  lVar10 = 1;
  lVar12 = 0;
  pfVar11 = pfVar2;
  pfVar13 = pfVar1;
  do {
    if (lVar12 == 3) {
      if (forcePositiveDeterminant) {
        fVar18 = Matrix44<float>::determinant(U);
        if (fVar18 < 0.0) {
          for (lVar10 = 0; lVar10 != 0x40; lVar10 = lVar10 + 0x10) {
            *(uint *)((long)U->x[0] + lVar10 + 0xc) =
                 *(uint *)((long)U->x[0] + lVar10 + 0xc) ^ 0x80000000;
          }
          S->w = -S->w;
        }
        fVar18 = Matrix44<float>::determinant(V);
        if (fVar18 < 0.0) {
          for (lVar10 = 0; lVar10 != 0x40; lVar10 = lVar10 + 0x10) {
            *(uint *)((long)V->x[0] + lVar10 + 0xc) =
                 *(uint *)((long)V->x[0] + lVar10 + 0xc) ^ 0x80000000;
          }
          S->w = -S->w;
        }
      }
      return;
    }
    uCol.x = U->x[0][lVar10];
    uCol.y = U->x[1][lVar10];
    uCol.z = U->x[2][lVar10];
    uCol.w = U->x[3][lVar10];
    local_90[0] = V->x[0][lVar10];
    local_90[1] = V->x[1][lVar10];
    local_90[2] = V->x[2][lVar10];
    local_90[3] = V->x[3][lVar10];
    fVar18 = (&S->x)[lVar10];
    lVar14 = lVar12;
    pfVar15 = pfVar11;
    pfVar16 = pfVar13;
    do {
      lVar17 = lVar14;
      if (ABS(fVar18) <= ABS((&S->x)[lVar14])) break;
      for (lVar17 = 0; lVar17 != 0x40; lVar17 = lVar17 + 0x10) {
        *(undefined4 *)((long)pfVar16 + lVar17) = *(undefined4 *)((long)pfVar16 + lVar17 + -4);
      }
      for (lVar17 = 0; lVar17 != 0x40; lVar17 = lVar17 + 0x10) {
        *(undefined4 *)((long)pfVar15 + lVar17) = *(undefined4 *)((long)pfVar15 + lVar17 + -4);
      }
      (&S->y)[lVar14] = (&S->x)[lVar14];
      pfVar16 = pfVar16 + -1;
      pfVar15 = pfVar15 + -1;
      bVar4 = 0 < lVar14;
      lVar17 = -1;
      lVar14 = lVar14 + -1;
    } while (bVar4);
    lVar14 = (long)(int)lVar17;
    for (lVar17 = 0; lVar17 != 0x10; lVar17 = lVar17 + 4) {
      pfVar1[lVar14 + lVar17] = *(float *)((long)(local_70.x + -1) + lVar17);
    }
    for (lVar17 = 0; lVar17 != 0x10; lVar17 = lVar17 + 4) {
      pfVar2[lVar14 + lVar17] = *(float *)((long)local_90 + lVar17);
    }
    (&S->y)[lVar14] = fVar18;
    lVar10 = lVar10 + 1;
    lVar12 = lVar12 + 1;
    pfVar13 = pfVar13 + 1;
    pfVar11 = pfVar11 + 1;
  } while( true );
}

Assistant:

void
jacobiSVD (
    const IMATH_INTERNAL_NAMESPACE::Matrix44<T>& A,
    IMATH_INTERNAL_NAMESPACE::Matrix44<T>&       U,
    IMATH_INTERNAL_NAMESPACE::Vec4<T>&           S,
    IMATH_INTERNAL_NAMESPACE::Matrix44<T>&       V,
    const T                                      tol,
    const bool                                   forcePositiveDeterminant)
{
    twoSidedJacobiSVD (A, U, S, V, tol, forcePositiveDeterminant);
}